

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.cpp
# Opt level: O0

void * __thiscall
CNetObjHandler::SecureUnpackMsg(CNetObjHandler *this,int Type,CUnpacker *pUnpacker)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  uchar *puVar5;
  char *pcVar6;
  CUnpacker *pCVar7;
  CUnpacker *in_RDX;
  int in_ESI;
  CNetObjHandler *in_RDI;
  CNetMsg_Cl_Command *pMsg_38;
  CNetMsg_Sv_CommandInfoRemove *pMsg_37;
  CNetMsg_Sv_CommandInfo *pMsg_36;
  CNetMsg_Sv_Checkpoint *pMsg_35;
  CNetMsg_Sv_RaceFinish *pMsg_34;
  CNetMsg_Cl_SkinChange *pMsg_33;
  CNetMsg_Sv_SkinChange *pMsg_32;
  CNetMsg_Cl_CallVote *pMsg_31;
  CNetMsg_Cl_Vote *pMsg_30;
  CNetMsg_Cl_Emoticon *pMsg_29;
  CNetMsg_Cl_ReadyChange *pMsg_28;
  CNetMsg_Cl_Kill *pMsg_27;
  CNetMsg_Cl_StartInfo *pMsg_26;
  CNetMsg_Cl_SetSpectatorMode *pMsg_25;
  CNetMsg_Cl_SetTeam *pMsg_24;
  CNetMsg_Cl_Say *pMsg_23;
  CNetMsg_De_ClientLeave *pMsg_22;
  CNetMsg_De_ClientEnter *pMsg_21;
  CNetMsg_Sv_GameMsg *pMsg_20;
  CNetMsg_Sv_ClientDrop *pMsg_19;
  CNetMsg_Sv_GameInfo *pMsg_18;
  CNetMsg_Sv_ClientInfo *pMsg_17;
  CNetMsg_Sv_ServerSettings *pMsg_16;
  CNetMsg_Sv_VoteStatus *pMsg_15;
  CNetMsg_Sv_VoteSet *pMsg_14;
  CNetMsg_Sv_VoteOptionRemove *pMsg_13;
  CNetMsg_Sv_VoteOptionAdd *pMsg_12;
  CNetMsg_Sv_VoteOptionListAdd *pMsg_11;
  CNetMsg_Sv_VoteClearOptions *pMsg_10;
  CNetMsg_Sv_Emoticon *pMsg_9;
  CNetMsg_Sv_WeaponPickup *pMsg_8;
  CNetMsg_Sv_ReadyToEnter *pMsg_7;
  CNetMsg_Sv_ExtraProjectile *pMsg_6;
  CNetMsg_Sv_TuneParams *pMsg_5;
  CNetMsg_Sv_KillMsg *pMsg_4;
  CNetMsg_Sv_Team *pMsg_3;
  CNetMsg_Sv_Chat *pMsg_2;
  CNetMsg_Sv_Broadcast *pMsg_1;
  CNetMsg_Sv_Motd *pMsg;
  CUnpacker *in_stack_fffffffffffffea8;
  undefined8 in_stack_fffffffffffffeb0;
  CUnpacker *in_stack_fffffffffffffeb8;
  char *local_8;
  
  iVar3 = (int)((ulong)in_stack_fffffffffffffeb0 >> 0x20);
  in_RDI->m_pMsgFailedOn = (char *)0x0;
  in_RDI->m_pObjFailedOn = (char *)0x0;
  pCVar7 = (CUnpacker *)(ulong)(in_ESI - 1);
  switch(pCVar7) {
  case (CUnpacker *)0x0:
    pcVar4 = CUnpacker::GetString(in_stack_fffffffffffffeb8,iVar3);
    *(char **)in_RDI->m_aMsgData = pcVar4;
    break;
  case (CUnpacker *)0x1:
    pcVar4 = CUnpacker::GetString(in_stack_fffffffffffffeb8,iVar3);
    *(char **)in_RDI->m_aMsgData = pcVar4;
    break;
  case (CUnpacker *)0x2:
    iVar2 = CUnpacker::GetInt(pCVar7);
    *(int *)in_RDI->m_aMsgData = iVar2;
    iVar2 = CUnpacker::GetInt(pCVar7);
    *(int *)(in_RDI->m_aMsgData + 4) = iVar2;
    iVar2 = CUnpacker::GetInt(pCVar7);
    *(int *)(in_RDI->m_aMsgData + 8) = iVar2;
    pcVar4 = CUnpacker::GetString(in_stack_fffffffffffffeb8,iVar3);
    *(char **)(in_RDI->m_aMsgData + 0x10) = pcVar4;
    bVar1 = CheckInt(in_RDI,"m_Mode",*(int *)in_RDI->m_aMsgData,0,3);
    if ((bVar1) &&
       (bVar1 = CheckInt(in_RDI,"m_ClientID",*(int *)(in_RDI->m_aMsgData + 4),-1,0x3f), bVar1)) {
      CheckInt(in_RDI,"m_TargetID",*(int *)(in_RDI->m_aMsgData + 8),-1,0x3f);
    }
    break;
  case (CUnpacker *)0x3:
    iVar3 = CUnpacker::GetInt(pCVar7);
    *(int *)in_RDI->m_aMsgData = iVar3;
    iVar3 = CUnpacker::GetInt(pCVar7);
    *(int *)(in_RDI->m_aMsgData + 4) = iVar3;
    iVar3 = CUnpacker::GetInt(pCVar7);
    *(int *)(in_RDI->m_aMsgData + 8) = iVar3;
    iVar3 = CUnpacker::GetInt(pCVar7);
    *(int *)(in_RDI->m_aMsgData + 0xc) = iVar3;
    bVar1 = CheckInt(in_RDI,"m_ClientID",*(int *)in_RDI->m_aMsgData,-1,0x3f);
    if (((bVar1) && (bVar1 = CheckInt(in_RDI,"m_Team",*(int *)(in_RDI->m_aMsgData + 4),-1,1), bVar1)
        ) && (bVar1 = CheckInt(in_RDI,"m_Silent",*(int *)(in_RDI->m_aMsgData + 8),0,1), bVar1)) {
      CheckInt(in_RDI,"m_CooldownTick",*(int *)(in_RDI->m_aMsgData + 0xc),0,0x7fffffff);
    }
    break;
  case (CUnpacker *)0x4:
    iVar3 = CUnpacker::GetInt(pCVar7);
    *(int *)in_RDI->m_aMsgData = iVar3;
    iVar3 = CUnpacker::GetInt(pCVar7);
    *(int *)(in_RDI->m_aMsgData + 4) = iVar3;
    iVar3 = CUnpacker::GetInt(pCVar7);
    *(int *)(in_RDI->m_aMsgData + 8) = iVar3;
    iVar3 = CUnpacker::GetInt(pCVar7);
    *(int *)(in_RDI->m_aMsgData + 0xc) = iVar3;
    bVar1 = CheckInt(in_RDI,"m_Killer",*(int *)in_RDI->m_aMsgData,-2,0x3f);
    if ((bVar1) &&
       (bVar1 = CheckInt(in_RDI,"m_Victim",*(int *)(in_RDI->m_aMsgData + 4),0,0x3f), bVar1)) {
      CheckInt(in_RDI,"m_Weapon",*(int *)(in_RDI->m_aMsgData + 8),-3,5);
    }
    break;
  case (CUnpacker *)0x5:
    break;
  case (CUnpacker *)0x6:
    break;
  case (CUnpacker *)0x7:
    break;
  case (CUnpacker *)0x8:
    iVar3 = CUnpacker::GetInt(pCVar7);
    *(int *)in_RDI->m_aMsgData = iVar3;
    CheckInt(in_RDI,"m_Weapon",*(int *)in_RDI->m_aMsgData,0,5);
    break;
  case (CUnpacker *)0x9:
    iVar3 = CUnpacker::GetInt(pCVar7);
    *(int *)in_RDI->m_aMsgData = iVar3;
    iVar3 = CUnpacker::GetInt(pCVar7);
    *(int *)(in_RDI->m_aMsgData + 4) = iVar3;
    bVar1 = CheckInt(in_RDI,"m_ClientID",*(int *)in_RDI->m_aMsgData,0,0x3f);
    if (bVar1) {
      CheckInt(in_RDI,"m_Emoticon",*(int *)(in_RDI->m_aMsgData + 4),0,0xf);
    }
    break;
  case (CUnpacker *)0xa:
    break;
  case (CUnpacker *)0xb:
    break;
  case (CUnpacker *)0xc:
    pcVar4 = CUnpacker::GetString(in_stack_fffffffffffffeb8,iVar3);
    *(char **)in_RDI->m_aMsgData = pcVar4;
    break;
  case (CUnpacker *)0xd:
    pcVar4 = CUnpacker::GetString(in_stack_fffffffffffffeb8,iVar3);
    *(char **)in_RDI->m_aMsgData = pcVar4;
    break;
  case (CUnpacker *)0xe:
    iVar2 = CUnpacker::GetInt(pCVar7);
    *(int *)in_RDI->m_aMsgData = iVar2;
    iVar2 = CUnpacker::GetInt(pCVar7);
    *(int *)(in_RDI->m_aMsgData + 4) = iVar2;
    iVar2 = CUnpacker::GetInt(pCVar7);
    *(int *)(in_RDI->m_aMsgData + 8) = iVar2;
    pcVar4 = CUnpacker::GetString(in_stack_fffffffffffffeb8,iVar3);
    *(char **)(in_RDI->m_aMsgData + 0x10) = pcVar4;
    pcVar4 = CUnpacker::GetString(in_stack_fffffffffffffeb8,iVar3);
    *(char **)(in_RDI->m_aMsgData + 0x18) = pcVar4;
    bVar1 = CheckInt(in_RDI,"m_ClientID",*(int *)in_RDI->m_aMsgData,-1,0x3f);
    if ((bVar1) && (bVar1 = CheckInt(in_RDI,"m_Type",*(int *)(in_RDI->m_aMsgData + 4),0,6), bVar1))
    {
      CheckInt(in_RDI,"m_Timeout",*(int *)(in_RDI->m_aMsgData + 8),0,0x3c);
    }
    break;
  case (CUnpacker *)0xf:
    iVar3 = CUnpacker::GetInt(pCVar7);
    *(int *)in_RDI->m_aMsgData = iVar3;
    iVar3 = CUnpacker::GetInt(pCVar7);
    *(int *)(in_RDI->m_aMsgData + 4) = iVar3;
    iVar3 = CUnpacker::GetInt(pCVar7);
    *(int *)(in_RDI->m_aMsgData + 8) = iVar3;
    iVar3 = CUnpacker::GetInt(pCVar7);
    *(int *)(in_RDI->m_aMsgData + 0xc) = iVar3;
    bVar1 = CheckInt(in_RDI,"m_Yes",*(int *)in_RDI->m_aMsgData,0,0x40);
    if (((bVar1) && (bVar1 = CheckInt(in_RDI,"m_No",*(int *)(in_RDI->m_aMsgData + 4),0,0x40), bVar1)
        ) && (bVar1 = CheckInt(in_RDI,"m_Pass",*(int *)(in_RDI->m_aMsgData + 8),0,0x40), bVar1)) {
      CheckInt(in_RDI,"m_Total",*(int *)(in_RDI->m_aMsgData + 0xc),0,0x40);
    }
    break;
  case (CUnpacker *)0x10:
    iVar3 = CUnpacker::GetInt(pCVar7);
    *(int *)in_RDI->m_aMsgData = iVar3;
    iVar3 = CUnpacker::GetInt(pCVar7);
    *(int *)(in_RDI->m_aMsgData + 4) = iVar3;
    iVar3 = CUnpacker::GetInt(pCVar7);
    *(int *)(in_RDI->m_aMsgData + 8) = iVar3;
    iVar3 = CUnpacker::GetInt(pCVar7);
    *(int *)(in_RDI->m_aMsgData + 0xc) = iVar3;
    iVar3 = CUnpacker::GetInt(pCVar7);
    *(int *)(in_RDI->m_aMsgData + 0x10) = iVar3;
    iVar3 = CUnpacker::GetInt(pCVar7);
    *(int *)(in_RDI->m_aMsgData + 0x14) = iVar3;
    bVar1 = CheckInt(in_RDI,"m_KickVote",*(int *)in_RDI->m_aMsgData,0,1);
    if (((bVar1) &&
        (bVar1 = CheckInt(in_RDI,"m_KickMin",*(int *)(in_RDI->m_aMsgData + 4),0,0x40), bVar1)) &&
       ((bVar1 = CheckInt(in_RDI,"m_SpecVote",*(int *)(in_RDI->m_aMsgData + 8),0,1), bVar1 &&
        ((bVar1 = CheckInt(in_RDI,"m_TeamLock",*(int *)(in_RDI->m_aMsgData + 0xc),0,1), bVar1 &&
         (bVar1 = CheckInt(in_RDI,"m_TeamBalance",*(int *)(in_RDI->m_aMsgData + 0x10),0,1), bVar1)))
        ))) {
      CheckInt(in_RDI,"m_PlayerSlots",*(int *)(in_RDI->m_aMsgData + 0x14),0,0x40);
    }
    break;
  case (CUnpacker *)0x11:
    iVar2 = CUnpacker::GetInt(pCVar7);
    *(int *)in_RDI->m_aMsgData = iVar2;
    iVar2 = CUnpacker::GetInt(pCVar7);
    *(int *)(in_RDI->m_aMsgData + 4) = iVar2;
    iVar2 = CUnpacker::GetInt(pCVar7);
    *(int *)(in_RDI->m_aMsgData + 8) = iVar2;
    pcVar4 = CUnpacker::GetString(in_stack_fffffffffffffeb8,iVar3);
    *(char **)(in_RDI->m_aMsgData + 0x10) = pcVar4;
    pcVar4 = CUnpacker::GetString(in_stack_fffffffffffffeb8,iVar3);
    *(char **)(in_RDI->m_aMsgData + 0x18) = pcVar4;
    iVar2 = CUnpacker::GetInt(pCVar7);
    *(int *)(in_RDI->m_aMsgData + 0x20) = iVar2;
    pcVar4 = CUnpacker::GetString(in_stack_fffffffffffffeb8,iVar3);
    *(char **)(in_RDI->m_aMsgData + 0x28) = pcVar4;
    pcVar4 = CUnpacker::GetString(in_stack_fffffffffffffeb8,iVar3);
    *(char **)(in_RDI->m_aMsgData + 0x30) = pcVar4;
    pcVar4 = CUnpacker::GetString(in_stack_fffffffffffffeb8,iVar3);
    *(char **)(in_RDI->m_aMsgData + 0x38) = pcVar4;
    pcVar4 = CUnpacker::GetString(in_stack_fffffffffffffeb8,iVar3);
    *(char **)(in_RDI->m_aMsgData + 0x40) = pcVar4;
    pcVar4 = CUnpacker::GetString(in_stack_fffffffffffffeb8,iVar3);
    *(char **)(in_RDI->m_aMsgData + 0x48) = pcVar4;
    pcVar4 = CUnpacker::GetString(in_stack_fffffffffffffeb8,iVar3);
    *(char **)(in_RDI->m_aMsgData + 0x50) = pcVar4;
    iVar3 = CUnpacker::GetInt(pCVar7);
    *(int *)(in_RDI->m_aMsgData + 0x58) = iVar3;
    iVar3 = CUnpacker::GetInt(pCVar7);
    *(int *)(in_RDI->m_aMsgData + 0x5c) = iVar3;
    iVar3 = CUnpacker::GetInt(pCVar7);
    *(int *)(in_RDI->m_aMsgData + 0x60) = iVar3;
    iVar3 = CUnpacker::GetInt(pCVar7);
    *(int *)(in_RDI->m_aMsgData + 100) = iVar3;
    iVar3 = CUnpacker::GetInt(pCVar7);
    *(int *)(in_RDI->m_aMsgData + 0x68) = iVar3;
    iVar3 = CUnpacker::GetInt(pCVar7);
    *(int *)(in_RDI->m_aMsgData + 0x6c) = iVar3;
    iVar3 = CUnpacker::GetInt(pCVar7);
    *(int *)(in_RDI->m_aMsgData + 0x70) = iVar3;
    iVar3 = CUnpacker::GetInt(pCVar7);
    *(int *)(in_RDI->m_aMsgData + 0x74) = iVar3;
    iVar3 = CUnpacker::GetInt(pCVar7);
    *(int *)(in_RDI->m_aMsgData + 0x78) = iVar3;
    iVar3 = CUnpacker::GetInt(pCVar7);
    *(int *)(in_RDI->m_aMsgData + 0x7c) = iVar3;
    iVar3 = CUnpacker::GetInt(pCVar7);
    *(int *)(in_RDI->m_aMsgData + 0x80) = iVar3;
    iVar3 = CUnpacker::GetInt(pCVar7);
    *(int *)(in_RDI->m_aMsgData + 0x84) = iVar3;
    iVar3 = CUnpacker::GetInt(pCVar7);
    *(int *)(in_RDI->m_aMsgData + 0x88) = iVar3;
    bVar1 = CheckInt(in_RDI,"m_ClientID",*(int *)in_RDI->m_aMsgData,0,0x3f);
    if (((((bVar1) &&
          (bVar1 = CheckInt(in_RDI,"m_Local",*(int *)(in_RDI->m_aMsgData + 4),0,1), bVar1)) &&
         ((bVar1 = CheckInt(in_RDI,"m_Team",*(int *)(in_RDI->m_aMsgData + 8),-1,1), bVar1 &&
          ((bVar1 = CheckInt(in_RDI,"m_aUseCustomColors[0]",*(int *)(in_RDI->m_aMsgData + 0x58),0,1)
           , bVar1 &&
           (bVar1 = CheckInt(in_RDI,"m_aUseCustomColors[1]",*(int *)(in_RDI->m_aMsgData + 0x5c),0,1)
           , bVar1)))))) &&
        (bVar1 = CheckInt(in_RDI,"m_aUseCustomColors[2]",*(int *)(in_RDI->m_aMsgData + 0x60),0,1),
        bVar1)) &&
       (((bVar1 = CheckInt(in_RDI,"m_aUseCustomColors[3]",*(int *)(in_RDI->m_aMsgData + 100),0,1),
         bVar1 && (bVar1 = CheckInt(in_RDI,"m_aUseCustomColors[4]",
                                    *(int *)(in_RDI->m_aMsgData + 0x68),0,1), bVar1)) &&
        (bVar1 = CheckInt(in_RDI,"m_aUseCustomColors[5]",*(int *)(in_RDI->m_aMsgData + 0x6c),0,1),
        bVar1)))) {
      CheckInt(in_RDI,"m_Silent",*(int *)(in_RDI->m_aMsgData + 0x88),0,1);
    }
    break;
  case (CUnpacker *)0x12:
    iVar3 = CUnpacker::GetInt(pCVar7);
    *(int *)in_RDI->m_aMsgData = iVar3;
    iVar3 = CUnpacker::GetInt(pCVar7);
    *(int *)(in_RDI->m_aMsgData + 4) = iVar3;
    iVar3 = CUnpacker::GetInt(pCVar7);
    *(int *)(in_RDI->m_aMsgData + 8) = iVar3;
    iVar3 = CUnpacker::GetInt(pCVar7);
    *(int *)(in_RDI->m_aMsgData + 0xc) = iVar3;
    iVar3 = CUnpacker::GetInt(pCVar7);
    *(int *)(in_RDI->m_aMsgData + 0x10) = iVar3;
    bVar1 = CheckFlag(in_RDI,"m_GameFlags",*(int *)in_RDI->m_aMsgData,0xf);
    if ((((bVar1) &&
         (bVar1 = CheckInt(in_RDI,"m_ScoreLimit",*(int *)(in_RDI->m_aMsgData + 4),0,0x7fffffff),
         bVar1)) &&
        (bVar1 = CheckInt(in_RDI,"m_TimeLimit",*(int *)(in_RDI->m_aMsgData + 8),0,0x7fffffff), bVar1
        )) && (bVar1 = CheckInt(in_RDI,"m_MatchNum",*(int *)(in_RDI->m_aMsgData + 0xc),0,0x7fffffff)
              , bVar1)) {
      CheckInt(in_RDI,"m_MatchCurrent",*(int *)(in_RDI->m_aMsgData + 0x10),0,0x7fffffff);
    }
    break;
  case (CUnpacker *)0x13:
    iVar2 = CUnpacker::GetInt(pCVar7);
    *(int *)in_RDI->m_aMsgData = iVar2;
    pcVar4 = CUnpacker::GetString(in_stack_fffffffffffffeb8,iVar3);
    *(char **)(in_RDI->m_aMsgData + 8) = pcVar4;
    iVar3 = CUnpacker::GetInt(pCVar7);
    *(int *)(in_RDI->m_aMsgData + 0x10) = iVar3;
    bVar1 = CheckInt(in_RDI,"m_ClientID",*(int *)in_RDI->m_aMsgData,0,0x3f);
    if (bVar1) {
      CheckInt(in_RDI,"m_Silent",*(int *)(in_RDI->m_aMsgData + 0x10),0,1);
    }
    break;
  case (CUnpacker *)0x14:
    break;
  case (CUnpacker *)0x15:
    pcVar4 = CUnpacker::GetString(in_stack_fffffffffffffeb8,iVar3);
    *(char **)in_RDI->m_aMsgData = pcVar4;
    iVar3 = CUnpacker::GetInt(pCVar7);
    *(int *)(in_RDI->m_aMsgData + 8) = iVar3;
    iVar3 = CUnpacker::GetInt(pCVar7);
    *(int *)(in_RDI->m_aMsgData + 0xc) = iVar3;
    bVar1 = CheckInt(in_RDI,"m_ClientID",*(int *)(in_RDI->m_aMsgData + 8),-1,0x3f);
    if (bVar1) {
      CheckInt(in_RDI,"m_Team",*(int *)(in_RDI->m_aMsgData + 0xc),-1,1);
    }
    break;
  case (CUnpacker *)0x16:
    pcVar4 = CUnpacker::GetString(in_stack_fffffffffffffeb8,iVar3);
    *(char **)in_RDI->m_aMsgData = pcVar4;
    iVar2 = CUnpacker::GetInt(pCVar7);
    *(int *)(in_RDI->m_aMsgData + 8) = iVar2;
    pcVar4 = CUnpacker::GetString(in_stack_fffffffffffffeb8,iVar3);
    *(char **)(in_RDI->m_aMsgData + 0x10) = pcVar4;
    CheckInt(in_RDI,"m_ClientID",*(int *)(in_RDI->m_aMsgData + 8),-1,0x3f);
    break;
  case (CUnpacker *)0x17:
    iVar2 = CUnpacker::GetInt(pCVar7);
    *(int *)in_RDI->m_aMsgData = iVar2;
    iVar2 = CUnpacker::GetInt(pCVar7);
    *(int *)(in_RDI->m_aMsgData + 4) = iVar2;
    pcVar4 = CUnpacker::GetString(in_stack_fffffffffffffeb8,iVar3);
    *(char **)(in_RDI->m_aMsgData + 8) = pcVar4;
    bVar1 = CheckInt(in_RDI,"m_Mode",*(int *)in_RDI->m_aMsgData,0,3);
    if (bVar1) {
      CheckInt(in_RDI,"m_Target",*(int *)(in_RDI->m_aMsgData + 4),-1,0x3f);
    }
    break;
  case (CUnpacker *)0x18:
    iVar3 = CUnpacker::GetInt(pCVar7);
    *(int *)in_RDI->m_aMsgData = iVar3;
    CheckInt(in_RDI,"m_Team",*(int *)in_RDI->m_aMsgData,-1,1);
    break;
  case (CUnpacker *)0x19:
    iVar3 = CUnpacker::GetInt(pCVar7);
    *(int *)in_RDI->m_aMsgData = iVar3;
    iVar3 = CUnpacker::GetInt(pCVar7);
    *(int *)(in_RDI->m_aMsgData + 4) = iVar3;
    bVar1 = CheckInt(in_RDI,"m_SpecMode",*(int *)in_RDI->m_aMsgData,0,3);
    if (bVar1) {
      CheckInt(in_RDI,"m_SpectatorID",*(int *)(in_RDI->m_aMsgData + 4),-1,0x3f);
    }
    break;
  case (CUnpacker *)0x1a:
    pcVar4 = CUnpacker::GetString(in_stack_fffffffffffffeb8,iVar3);
    *(char **)in_RDI->m_aMsgData = pcVar4;
    pcVar4 = CUnpacker::GetString(in_stack_fffffffffffffeb8,iVar3);
    *(char **)(in_RDI->m_aMsgData + 8) = pcVar4;
    iVar2 = CUnpacker::GetInt(pCVar7);
    *(int *)(in_RDI->m_aMsgData + 0x10) = iVar2;
    pcVar4 = CUnpacker::GetString(in_stack_fffffffffffffeb8,iVar3);
    *(char **)(in_RDI->m_aMsgData + 0x18) = pcVar4;
    pcVar4 = CUnpacker::GetString(in_stack_fffffffffffffeb8,iVar3);
    *(char **)(in_RDI->m_aMsgData + 0x20) = pcVar4;
    pcVar4 = CUnpacker::GetString(in_stack_fffffffffffffeb8,iVar3);
    *(char **)(in_RDI->m_aMsgData + 0x28) = pcVar4;
    pcVar4 = CUnpacker::GetString(in_stack_fffffffffffffeb8,iVar3);
    *(char **)(in_RDI->m_aMsgData + 0x30) = pcVar4;
    pcVar4 = CUnpacker::GetString(in_stack_fffffffffffffeb8,iVar3);
    *(char **)(in_RDI->m_aMsgData + 0x38) = pcVar4;
    pcVar4 = CUnpacker::GetString(in_stack_fffffffffffffeb8,iVar3);
    *(char **)(in_RDI->m_aMsgData + 0x40) = pcVar4;
    iVar3 = CUnpacker::GetInt(pCVar7);
    *(int *)(in_RDI->m_aMsgData + 0x48) = iVar3;
    iVar3 = CUnpacker::GetInt(pCVar7);
    *(int *)(in_RDI->m_aMsgData + 0x4c) = iVar3;
    iVar3 = CUnpacker::GetInt(pCVar7);
    *(int *)(in_RDI->m_aMsgData + 0x50) = iVar3;
    iVar3 = CUnpacker::GetInt(pCVar7);
    *(int *)(in_RDI->m_aMsgData + 0x54) = iVar3;
    iVar3 = CUnpacker::GetInt(pCVar7);
    *(int *)(in_RDI->m_aMsgData + 0x58) = iVar3;
    iVar3 = CUnpacker::GetInt(pCVar7);
    *(int *)(in_RDI->m_aMsgData + 0x5c) = iVar3;
    iVar3 = CUnpacker::GetInt(pCVar7);
    *(int *)(in_RDI->m_aMsgData + 0x60) = iVar3;
    iVar3 = CUnpacker::GetInt(pCVar7);
    *(int *)(in_RDI->m_aMsgData + 100) = iVar3;
    iVar3 = CUnpacker::GetInt(pCVar7);
    *(int *)(in_RDI->m_aMsgData + 0x68) = iVar3;
    iVar3 = CUnpacker::GetInt(pCVar7);
    *(int *)(in_RDI->m_aMsgData + 0x6c) = iVar3;
    iVar3 = CUnpacker::GetInt(pCVar7);
    *(int *)(in_RDI->m_aMsgData + 0x70) = iVar3;
    iVar3 = CUnpacker::GetInt(pCVar7);
    *(int *)(in_RDI->m_aMsgData + 0x74) = iVar3;
    bVar1 = CheckInt(in_RDI,"m_aUseCustomColors[0]",*(int *)(in_RDI->m_aMsgData + 0x48),0,1);
    if (((bVar1) &&
        (bVar1 = CheckInt(in_RDI,"m_aUseCustomColors[1]",*(int *)(in_RDI->m_aMsgData + 0x4c),0,1),
        bVar1)) &&
       ((bVar1 = CheckInt(in_RDI,"m_aUseCustomColors[2]",*(int *)(in_RDI->m_aMsgData + 0x50),0,1),
        bVar1 && ((bVar1 = CheckInt(in_RDI,"m_aUseCustomColors[3]",
                                    *(int *)(in_RDI->m_aMsgData + 0x54),0,1), bVar1 &&
                  (bVar1 = CheckInt(in_RDI,"m_aUseCustomColors[4]",
                                    *(int *)(in_RDI->m_aMsgData + 0x58),0,1), bVar1)))))) {
      CheckInt(in_RDI,"m_aUseCustomColors[5]",*(int *)(in_RDI->m_aMsgData + 0x5c),0,1);
    }
    break;
  case (CUnpacker *)0x1b:
    break;
  case (CUnpacker *)0x1c:
    break;
  case (CUnpacker *)0x1d:
    iVar3 = CUnpacker::GetInt(pCVar7);
    *(int *)in_RDI->m_aMsgData = iVar3;
    CheckInt(in_RDI,"m_Emoticon",*(int *)in_RDI->m_aMsgData,0,0xf);
    break;
  case (CUnpacker *)0x1e:
    iVar3 = CUnpacker::GetInt(pCVar7);
    *(int *)in_RDI->m_aMsgData = iVar3;
    CheckInt(in_RDI,"m_Vote",*(int *)in_RDI->m_aMsgData,-1,1);
    break;
  case (CUnpacker *)0x1f:
    pcVar4 = CUnpacker::GetString(in_stack_fffffffffffffeb8,iVar3);
    *(char **)in_RDI->m_aMsgData = pcVar4;
    pcVar4 = CUnpacker::GetString(in_stack_fffffffffffffeb8,iVar3);
    *(char **)(in_RDI->m_aMsgData + 8) = pcVar4;
    pcVar4 = CUnpacker::GetString(in_stack_fffffffffffffeb8,iVar3);
    *(char **)(in_RDI->m_aMsgData + 0x10) = pcVar4;
    iVar3 = CUnpacker::GetInt(pCVar7);
    *(int *)(in_RDI->m_aMsgData + 0x18) = iVar3;
    CheckInt(in_RDI,"m_Force",*(int *)(in_RDI->m_aMsgData + 0x18),0,1);
    break;
  case (CUnpacker *)0x20:
    iVar2 = CUnpacker::GetInt(pCVar7);
    *(int *)in_RDI->m_aMsgData = iVar2;
    pcVar4 = CUnpacker::GetString(in_stack_fffffffffffffeb8,iVar3);
    *(char **)(in_RDI->m_aMsgData + 8) = pcVar4;
    pcVar4 = CUnpacker::GetString(in_stack_fffffffffffffeb8,iVar3);
    *(char **)(in_RDI->m_aMsgData + 0x10) = pcVar4;
    pcVar4 = CUnpacker::GetString(in_stack_fffffffffffffeb8,iVar3);
    *(char **)(in_RDI->m_aMsgData + 0x18) = pcVar4;
    pcVar4 = CUnpacker::GetString(in_stack_fffffffffffffeb8,iVar3);
    *(char **)(in_RDI->m_aMsgData + 0x20) = pcVar4;
    pcVar4 = CUnpacker::GetString(in_stack_fffffffffffffeb8,iVar3);
    *(char **)(in_RDI->m_aMsgData + 0x28) = pcVar4;
    pcVar4 = CUnpacker::GetString(in_stack_fffffffffffffeb8,iVar3);
    *(char **)(in_RDI->m_aMsgData + 0x30) = pcVar4;
    iVar3 = CUnpacker::GetInt(pCVar7);
    *(int *)(in_RDI->m_aMsgData + 0x38) = iVar3;
    iVar3 = CUnpacker::GetInt(pCVar7);
    *(int *)(in_RDI->m_aMsgData + 0x3c) = iVar3;
    iVar3 = CUnpacker::GetInt(pCVar7);
    *(int *)(in_RDI->m_aMsgData + 0x40) = iVar3;
    iVar3 = CUnpacker::GetInt(pCVar7);
    *(int *)(in_RDI->m_aMsgData + 0x44) = iVar3;
    iVar3 = CUnpacker::GetInt(pCVar7);
    *(int *)(in_RDI->m_aMsgData + 0x48) = iVar3;
    iVar3 = CUnpacker::GetInt(pCVar7);
    *(int *)(in_RDI->m_aMsgData + 0x4c) = iVar3;
    iVar3 = CUnpacker::GetInt(pCVar7);
    *(int *)(in_RDI->m_aMsgData + 0x50) = iVar3;
    iVar3 = CUnpacker::GetInt(pCVar7);
    *(int *)(in_RDI->m_aMsgData + 0x54) = iVar3;
    iVar3 = CUnpacker::GetInt(pCVar7);
    *(int *)(in_RDI->m_aMsgData + 0x58) = iVar3;
    iVar3 = CUnpacker::GetInt(pCVar7);
    *(int *)(in_RDI->m_aMsgData + 0x5c) = iVar3;
    iVar3 = CUnpacker::GetInt(pCVar7);
    *(int *)(in_RDI->m_aMsgData + 0x60) = iVar3;
    iVar3 = CUnpacker::GetInt(pCVar7);
    *(int *)(in_RDI->m_aMsgData + 100) = iVar3;
    bVar1 = CheckInt(in_RDI,"m_ClientID",*(int *)in_RDI->m_aMsgData,0,0x3f);
    if (((((bVar1) &&
          (bVar1 = CheckInt(in_RDI,"m_aUseCustomColors[0]",*(int *)(in_RDI->m_aMsgData + 0x38),0,1),
          bVar1)) &&
         (bVar1 = CheckInt(in_RDI,"m_aUseCustomColors[1]",*(int *)(in_RDI->m_aMsgData + 0x3c),0,1),
         bVar1)) &&
        ((bVar1 = CheckInt(in_RDI,"m_aUseCustomColors[2]",*(int *)(in_RDI->m_aMsgData + 0x40),0,1),
         bVar1 && (bVar1 = CheckInt(in_RDI,"m_aUseCustomColors[3]",
                                    *(int *)(in_RDI->m_aMsgData + 0x44),0,1), bVar1)))) &&
       (bVar1 = CheckInt(in_RDI,"m_aUseCustomColors[4]",*(int *)(in_RDI->m_aMsgData + 0x48),0,1),
       bVar1)) {
      CheckInt(in_RDI,"m_aUseCustomColors[5]",*(int *)(in_RDI->m_aMsgData + 0x4c),0,1);
    }
    break;
  case (CUnpacker *)0x21:
    pcVar4 = CUnpacker::GetString(in_stack_fffffffffffffeb8,iVar3);
    *(char **)in_RDI->m_aMsgData = pcVar4;
    pcVar4 = CUnpacker::GetString(in_stack_fffffffffffffeb8,iVar3);
    *(char **)(in_RDI->m_aMsgData + 8) = pcVar4;
    pcVar4 = CUnpacker::GetString(in_stack_fffffffffffffeb8,iVar3);
    *(char **)(in_RDI->m_aMsgData + 0x10) = pcVar4;
    pcVar4 = CUnpacker::GetString(in_stack_fffffffffffffeb8,iVar3);
    *(char **)(in_RDI->m_aMsgData + 0x18) = pcVar4;
    pcVar4 = CUnpacker::GetString(in_stack_fffffffffffffeb8,iVar3);
    *(char **)(in_RDI->m_aMsgData + 0x20) = pcVar4;
    pcVar4 = CUnpacker::GetString(in_stack_fffffffffffffeb8,iVar3);
    *(char **)(in_RDI->m_aMsgData + 0x28) = pcVar4;
    iVar3 = CUnpacker::GetInt(pCVar7);
    *(int *)(in_RDI->m_aMsgData + 0x30) = iVar3;
    iVar3 = CUnpacker::GetInt(pCVar7);
    *(int *)(in_RDI->m_aMsgData + 0x34) = iVar3;
    iVar3 = CUnpacker::GetInt(pCVar7);
    *(int *)(in_RDI->m_aMsgData + 0x38) = iVar3;
    iVar3 = CUnpacker::GetInt(pCVar7);
    *(int *)(in_RDI->m_aMsgData + 0x3c) = iVar3;
    iVar3 = CUnpacker::GetInt(pCVar7);
    *(int *)(in_RDI->m_aMsgData + 0x40) = iVar3;
    iVar3 = CUnpacker::GetInt(pCVar7);
    *(int *)(in_RDI->m_aMsgData + 0x44) = iVar3;
    iVar3 = CUnpacker::GetInt(pCVar7);
    *(int *)(in_RDI->m_aMsgData + 0x48) = iVar3;
    iVar3 = CUnpacker::GetInt(pCVar7);
    *(int *)(in_RDI->m_aMsgData + 0x4c) = iVar3;
    iVar3 = CUnpacker::GetInt(pCVar7);
    *(int *)(in_RDI->m_aMsgData + 0x50) = iVar3;
    iVar3 = CUnpacker::GetInt(pCVar7);
    *(int *)(in_RDI->m_aMsgData + 0x54) = iVar3;
    iVar3 = CUnpacker::GetInt(pCVar7);
    *(int *)(in_RDI->m_aMsgData + 0x58) = iVar3;
    iVar3 = CUnpacker::GetInt(pCVar7);
    *(int *)(in_RDI->m_aMsgData + 0x5c) = iVar3;
    bVar1 = CheckInt(in_RDI,"m_aUseCustomColors[0]",*(int *)(in_RDI->m_aMsgData + 0x30),0,1);
    if (((bVar1) &&
        (bVar1 = CheckInt(in_RDI,"m_aUseCustomColors[1]",*(int *)(in_RDI->m_aMsgData + 0x34),0,1),
        bVar1)) &&
       ((bVar1 = CheckInt(in_RDI,"m_aUseCustomColors[2]",*(int *)(in_RDI->m_aMsgData + 0x38),0,1),
        bVar1 && ((bVar1 = CheckInt(in_RDI,"m_aUseCustomColors[3]",
                                    *(int *)(in_RDI->m_aMsgData + 0x3c),0,1), bVar1 &&
                  (bVar1 = CheckInt(in_RDI,"m_aUseCustomColors[4]",
                                    *(int *)(in_RDI->m_aMsgData + 0x40),0,1), bVar1)))))) {
      CheckInt(in_RDI,"m_aUseCustomColors[5]",*(int *)(in_RDI->m_aMsgData + 0x44),0,1);
    }
    break;
  case (CUnpacker *)0x22:
    iVar3 = CUnpacker::GetInt(pCVar7);
    *(int *)in_RDI->m_aMsgData = iVar3;
    iVar3 = CUnpacker::GetInt(pCVar7);
    *(int *)(in_RDI->m_aMsgData + 4) = iVar3;
    iVar3 = CUnpacker::GetInt(pCVar7);
    *(int *)(in_RDI->m_aMsgData + 8) = iVar3;
    iVar3 = CUnpacker::GetInt(pCVar7);
    *(int *)(in_RDI->m_aMsgData + 0xc) = iVar3;
    iVar3 = CUnpacker::GetIntOrDefault(in_stack_fffffffffffffea8,(int)((ulong)pCVar7 >> 0x20));
    *(int *)(in_RDI->m_aMsgData + 0x10) = iVar3;
    bVar1 = CheckInt(in_RDI,"m_ClientID",*(int *)in_RDI->m_aMsgData,0,0x3f);
    if (((bVar1) &&
        (bVar1 = CheckInt(in_RDI,"m_Time",*(int *)(in_RDI->m_aMsgData + 4),-1,0x7fffffff), bVar1))
       && (bVar1 = CheckInt(in_RDI,"m_RecordPersonal",*(int *)(in_RDI->m_aMsgData + 0xc),0,1), bVar1
          )) {
      CheckInt(in_RDI,"m_RecordServer",*(int *)(in_RDI->m_aMsgData + 0x10),0,1);
    }
    break;
  case (CUnpacker *)0x23:
    iVar3 = CUnpacker::GetInt(pCVar7);
    *(int *)in_RDI->m_aMsgData = iVar3;
    break;
  case (CUnpacker *)0x24:
    pCVar7 = (CUnpacker *)in_RDI->m_aMsgData;
    puVar5 = (uchar *)CUnpacker::GetString(pCVar7,iVar3);
    pCVar7->m_pStart = puVar5;
    puVar5 = (uchar *)CUnpacker::GetString(pCVar7,iVar3);
    pCVar7->m_pCurrent = puVar5;
    puVar5 = (uchar *)CUnpacker::GetString(pCVar7,iVar3);
    pCVar7->m_pEnd = puVar5;
    break;
  case (CUnpacker *)0x25:
    pcVar4 = in_RDI->m_aMsgData;
    pcVar6 = CUnpacker::GetString(in_stack_fffffffffffffeb8,(int)((ulong)pcVar4 >> 0x20));
    *(char **)pcVar4 = pcVar6;
    break;
  case (CUnpacker *)0x26:
    pcVar4 = in_RDI->m_aMsgData;
    pcVar6 = CUnpacker::GetString(in_stack_fffffffffffffeb8,iVar3);
    *(char **)pcVar4 = pcVar6;
    pcVar6 = CUnpacker::GetString(in_stack_fffffffffffffeb8,iVar3);
    *(char **)(pcVar4 + 8) = pcVar6;
    break;
  default:
    in_RDI->m_pMsgFailedOn = "(type out of range)";
  }
  bVar1 = CUnpacker::Error(in_RDX);
  if (bVar1) {
    in_RDI->m_pMsgFailedOn = "(unpack error)";
  }
  if ((in_RDI->m_pMsgFailedOn == (char *)0x0) && (in_RDI->m_pObjFailedOn == (char *)0x0)) {
    in_RDI->m_pMsgFailedOn = "";
    in_RDI->m_pObjFailedOn = "";
    local_8 = in_RDI->m_aMsgData;
  }
  else {
    if (in_RDI->m_pMsgFailedOn == (char *)0x0) {
      in_RDI->m_pMsgFailedOn = "";
    }
    if (in_RDI->m_pObjFailedOn == (char *)0x0) {
      in_RDI->m_pObjFailedOn = "";
    }
    local_8 = (char *)0x0;
  }
  return local_8;
}

Assistant:

void *CNetObjHandler::SecureUnpackMsg(int Type, CUnpacker *pUnpacker)
{
	m_pMsgFailedOn = 0;
	m_pObjFailedOn = 0;
	switch(Type)
	{
	case NETMSGTYPE_SV_MOTD:
	{
		CNetMsg_Sv_Motd *pMsg = (CNetMsg_Sv_Motd *)m_aMsgData;
		(void)pMsg;
		pMsg->m_pMessage = pUnpacker->GetString();
	} break;
	
	case NETMSGTYPE_SV_BROADCAST:
	{
		CNetMsg_Sv_Broadcast *pMsg = (CNetMsg_Sv_Broadcast *)m_aMsgData;
		(void)pMsg;
		pMsg->m_pMessage = pUnpacker->GetString();
	} break;
	
	case NETMSGTYPE_SV_CHAT:
	{
		CNetMsg_Sv_Chat *pMsg = (CNetMsg_Sv_Chat *)m_aMsgData;
		(void)pMsg;
		pMsg->m_Mode = pUnpacker->GetInt();
		pMsg->m_ClientID = pUnpacker->GetInt();
		pMsg->m_TargetID = pUnpacker->GetInt();
		pMsg->m_pMessage = pUnpacker->GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
		if(!CheckInt("m_Mode", pMsg->m_Mode, 0, NUM_CHATS-1)) break;
		if(!CheckInt("m_ClientID", pMsg->m_ClientID, -1, MAX_CLIENTS-1)) break;
		if(!CheckInt("m_TargetID", pMsg->m_TargetID, -1, MAX_CLIENTS-1)) break;
	} break;
	
	case NETMSGTYPE_SV_TEAM:
	{
		CNetMsg_Sv_Team *pMsg = (CNetMsg_Sv_Team *)m_aMsgData;
		(void)pMsg;
		pMsg->m_ClientID = pUnpacker->GetInt();
		pMsg->m_Team = pUnpacker->GetInt();
		pMsg->m_Silent = pUnpacker->GetInt();
		pMsg->m_CooldownTick = pUnpacker->GetInt();
		if(!CheckInt("m_ClientID", pMsg->m_ClientID, -1, MAX_CLIENTS-1)) break;
		if(!CheckInt("m_Team", pMsg->m_Team, TEAM_SPECTATORS, TEAM_BLUE)) break;
		if(!CheckInt("m_Silent", pMsg->m_Silent, 0, 1)) break;
		if(!CheckInt("m_CooldownTick", pMsg->m_CooldownTick, 0, max_int)) break;
	} break;
	
	case NETMSGTYPE_SV_KILLMSG:
	{
		CNetMsg_Sv_KillMsg *pMsg = (CNetMsg_Sv_KillMsg *)m_aMsgData;
		(void)pMsg;
		pMsg->m_Killer = pUnpacker->GetInt();
		pMsg->m_Victim = pUnpacker->GetInt();
		pMsg->m_Weapon = pUnpacker->GetInt();
		pMsg->m_ModeSpecial = pUnpacker->GetInt();
		if(!CheckInt("m_Killer", pMsg->m_Killer, -2, MAX_CLIENTS-1)) break;
		if(!CheckInt("m_Victim", pMsg->m_Victim, 0, MAX_CLIENTS-1)) break;
		if(!CheckInt("m_Weapon", pMsg->m_Weapon, -3, NUM_WEAPONS-1)) break;
	} break;
	
	case NETMSGTYPE_SV_TUNEPARAMS:
	{
		CNetMsg_Sv_TuneParams *pMsg = (CNetMsg_Sv_TuneParams *)m_aMsgData;
		(void)pMsg;
	} break;
	
	case NETMSGTYPE_SV_EXTRAPROJECTILE:
	{
		CNetMsg_Sv_ExtraProjectile *pMsg = (CNetMsg_Sv_ExtraProjectile *)m_aMsgData;
		(void)pMsg;
	} break;
	
	case NETMSGTYPE_SV_READYTOENTER:
	{
		CNetMsg_Sv_ReadyToEnter *pMsg = (CNetMsg_Sv_ReadyToEnter *)m_aMsgData;
		(void)pMsg;
	} break;
	
	case NETMSGTYPE_SV_WEAPONPICKUP:
	{
		CNetMsg_Sv_WeaponPickup *pMsg = (CNetMsg_Sv_WeaponPickup *)m_aMsgData;
		(void)pMsg;
		pMsg->m_Weapon = pUnpacker->GetInt();
		if(!CheckInt("m_Weapon", pMsg->m_Weapon, 0, NUM_WEAPONS-1)) break;
	} break;
	
	case NETMSGTYPE_SV_EMOTICON:
	{
		CNetMsg_Sv_Emoticon *pMsg = (CNetMsg_Sv_Emoticon *)m_aMsgData;
		(void)pMsg;
		pMsg->m_ClientID = pUnpacker->GetInt();
		pMsg->m_Emoticon = pUnpacker->GetInt();
		if(!CheckInt("m_ClientID", pMsg->m_ClientID, 0, MAX_CLIENTS-1)) break;
		if(!CheckInt("m_Emoticon", pMsg->m_Emoticon, 0, 15)) break;
	} break;
	
	case NETMSGTYPE_SV_VOTECLEAROPTIONS:
	{
		CNetMsg_Sv_VoteClearOptions *pMsg = (CNetMsg_Sv_VoteClearOptions *)m_aMsgData;
		(void)pMsg;
	} break;
	
	case NETMSGTYPE_SV_VOTEOPTIONLISTADD:
	{
		CNetMsg_Sv_VoteOptionListAdd *pMsg = (CNetMsg_Sv_VoteOptionListAdd *)m_aMsgData;
		(void)pMsg;
	} break;
	
	case NETMSGTYPE_SV_VOTEOPTIONADD:
	{
		CNetMsg_Sv_VoteOptionAdd *pMsg = (CNetMsg_Sv_VoteOptionAdd *)m_aMsgData;
		(void)pMsg;
		pMsg->m_pDescription = pUnpacker->GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
	} break;
	
	case NETMSGTYPE_SV_VOTEOPTIONREMOVE:
	{
		CNetMsg_Sv_VoteOptionRemove *pMsg = (CNetMsg_Sv_VoteOptionRemove *)m_aMsgData;
		(void)pMsg;
		pMsg->m_pDescription = pUnpacker->GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
	} break;
	
	case NETMSGTYPE_SV_VOTESET:
	{
		CNetMsg_Sv_VoteSet *pMsg = (CNetMsg_Sv_VoteSet *)m_aMsgData;
		(void)pMsg;
		pMsg->m_ClientID = pUnpacker->GetInt();
		pMsg->m_Type = pUnpacker->GetInt();
		pMsg->m_Timeout = pUnpacker->GetInt();
		pMsg->m_pDescription = pUnpacker->GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
		pMsg->m_pReason = pUnpacker->GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
		if(!CheckInt("m_ClientID", pMsg->m_ClientID, -1, MAX_CLIENTS-1)) break;
		if(!CheckInt("m_Type", pMsg->m_Type, 0, 6)) break;
		if(!CheckInt("m_Timeout", pMsg->m_Timeout, 0, 60)) break;
	} break;
	
	case NETMSGTYPE_SV_VOTESTATUS:
	{
		CNetMsg_Sv_VoteStatus *pMsg = (CNetMsg_Sv_VoteStatus *)m_aMsgData;
		(void)pMsg;
		pMsg->m_Yes = pUnpacker->GetInt();
		pMsg->m_No = pUnpacker->GetInt();
		pMsg->m_Pass = pUnpacker->GetInt();
		pMsg->m_Total = pUnpacker->GetInt();
		if(!CheckInt("m_Yes", pMsg->m_Yes, 0, MAX_CLIENTS)) break;
		if(!CheckInt("m_No", pMsg->m_No, 0, MAX_CLIENTS)) break;
		if(!CheckInt("m_Pass", pMsg->m_Pass, 0, MAX_CLIENTS)) break;
		if(!CheckInt("m_Total", pMsg->m_Total, 0, MAX_CLIENTS)) break;
	} break;
	
	case NETMSGTYPE_SV_SERVERSETTINGS:
	{
		CNetMsg_Sv_ServerSettings *pMsg = (CNetMsg_Sv_ServerSettings *)m_aMsgData;
		(void)pMsg;
		pMsg->m_KickVote = pUnpacker->GetInt();
		pMsg->m_KickMin = pUnpacker->GetInt();
		pMsg->m_SpecVote = pUnpacker->GetInt();
		pMsg->m_TeamLock = pUnpacker->GetInt();
		pMsg->m_TeamBalance = pUnpacker->GetInt();
		pMsg->m_PlayerSlots = pUnpacker->GetInt();
		if(!CheckInt("m_KickVote", pMsg->m_KickVote, 0, 1)) break;
		if(!CheckInt("m_KickMin", pMsg->m_KickMin, 0, MAX_CLIENTS)) break;
		if(!CheckInt("m_SpecVote", pMsg->m_SpecVote, 0, 1)) break;
		if(!CheckInt("m_TeamLock", pMsg->m_TeamLock, 0, 1)) break;
		if(!CheckInt("m_TeamBalance", pMsg->m_TeamBalance, 0, 1)) break;
		if(!CheckInt("m_PlayerSlots", pMsg->m_PlayerSlots, 0, MAX_CLIENTS)) break;
	} break;
	
	case NETMSGTYPE_SV_CLIENTINFO:
	{
		CNetMsg_Sv_ClientInfo *pMsg = (CNetMsg_Sv_ClientInfo *)m_aMsgData;
		(void)pMsg;
		pMsg->m_ClientID = pUnpacker->GetInt();
		pMsg->m_Local = pUnpacker->GetInt();
		pMsg->m_Team = pUnpacker->GetInt();
		pMsg->m_pName = pUnpacker->GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
		pMsg->m_pClan = pUnpacker->GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
		pMsg->m_Country = pUnpacker->GetInt();
		pMsg->m_apSkinPartNames[0] = pUnpacker->GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
		pMsg->m_apSkinPartNames[1] = pUnpacker->GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
		pMsg->m_apSkinPartNames[2] = pUnpacker->GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
		pMsg->m_apSkinPartNames[3] = pUnpacker->GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
		pMsg->m_apSkinPartNames[4] = pUnpacker->GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
		pMsg->m_apSkinPartNames[5] = pUnpacker->GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
		pMsg->m_aUseCustomColors[0] = pUnpacker->GetInt();
		pMsg->m_aUseCustomColors[1] = pUnpacker->GetInt();
		pMsg->m_aUseCustomColors[2] = pUnpacker->GetInt();
		pMsg->m_aUseCustomColors[3] = pUnpacker->GetInt();
		pMsg->m_aUseCustomColors[4] = pUnpacker->GetInt();
		pMsg->m_aUseCustomColors[5] = pUnpacker->GetInt();
		pMsg->m_aSkinPartColors[0] = pUnpacker->GetInt();
		pMsg->m_aSkinPartColors[1] = pUnpacker->GetInt();
		pMsg->m_aSkinPartColors[2] = pUnpacker->GetInt();
		pMsg->m_aSkinPartColors[3] = pUnpacker->GetInt();
		pMsg->m_aSkinPartColors[4] = pUnpacker->GetInt();
		pMsg->m_aSkinPartColors[5] = pUnpacker->GetInt();
		pMsg->m_Silent = pUnpacker->GetInt();
		if(!CheckInt("m_ClientID", pMsg->m_ClientID, 0, MAX_CLIENTS-1)) break;
		if(!CheckInt("m_Local", pMsg->m_Local, 0, 1)) break;
		if(!CheckInt("m_Team", pMsg->m_Team, TEAM_SPECTATORS, TEAM_BLUE)) break;
		if(!CheckInt("m_aUseCustomColors[0]", pMsg->m_aUseCustomColors[0], 0, 1)) break;
		if(!CheckInt("m_aUseCustomColors[1]", pMsg->m_aUseCustomColors[1], 0, 1)) break;
		if(!CheckInt("m_aUseCustomColors[2]", pMsg->m_aUseCustomColors[2], 0, 1)) break;
		if(!CheckInt("m_aUseCustomColors[3]", pMsg->m_aUseCustomColors[3], 0, 1)) break;
		if(!CheckInt("m_aUseCustomColors[4]", pMsg->m_aUseCustomColors[4], 0, 1)) break;
		if(!CheckInt("m_aUseCustomColors[5]", pMsg->m_aUseCustomColors[5], 0, 1)) break;
		if(!CheckInt("m_Silent", pMsg->m_Silent, 0, 1)) break;
	} break;
	
	case NETMSGTYPE_SV_GAMEINFO:
	{
		CNetMsg_Sv_GameInfo *pMsg = (CNetMsg_Sv_GameInfo *)m_aMsgData;
		(void)pMsg;
		pMsg->m_GameFlags = pUnpacker->GetInt();
		pMsg->m_ScoreLimit = pUnpacker->GetInt();
		pMsg->m_TimeLimit = pUnpacker->GetInt();
		pMsg->m_MatchNum = pUnpacker->GetInt();
		pMsg->m_MatchCurrent = pUnpacker->GetInt();
		if(!CheckFlag("m_GameFlags", pMsg->m_GameFlags, GAMEFLAG_TEAMS|GAMEFLAG_FLAGS|GAMEFLAG_SURVIVAL|GAMEFLAG_RACE)) break;
		if(!CheckInt("m_ScoreLimit", pMsg->m_ScoreLimit, 0, max_int)) break;
		if(!CheckInt("m_TimeLimit", pMsg->m_TimeLimit, 0, max_int)) break;
		if(!CheckInt("m_MatchNum", pMsg->m_MatchNum, 0, max_int)) break;
		if(!CheckInt("m_MatchCurrent", pMsg->m_MatchCurrent, 0, max_int)) break;
	} break;
	
	case NETMSGTYPE_SV_CLIENTDROP:
	{
		CNetMsg_Sv_ClientDrop *pMsg = (CNetMsg_Sv_ClientDrop *)m_aMsgData;
		(void)pMsg;
		pMsg->m_ClientID = pUnpacker->GetInt();
		pMsg->m_pReason = pUnpacker->GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
		pMsg->m_Silent = pUnpacker->GetInt();
		if(!CheckInt("m_ClientID", pMsg->m_ClientID, 0, MAX_CLIENTS-1)) break;
		if(!CheckInt("m_Silent", pMsg->m_Silent, 0, 1)) break;
	} break;
	
	case NETMSGTYPE_SV_GAMEMSG:
	{
		CNetMsg_Sv_GameMsg *pMsg = (CNetMsg_Sv_GameMsg *)m_aMsgData;
		(void)pMsg;
	} break;
	
	case NETMSGTYPE_DE_CLIENTENTER:
	{
		CNetMsg_De_ClientEnter *pMsg = (CNetMsg_De_ClientEnter *)m_aMsgData;
		(void)pMsg;
		pMsg->m_pName = pUnpacker->GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
		pMsg->m_ClientID = pUnpacker->GetInt();
		pMsg->m_Team = pUnpacker->GetInt();
		if(!CheckInt("m_ClientID", pMsg->m_ClientID, -1, MAX_CLIENTS-1)) break;
		if(!CheckInt("m_Team", pMsg->m_Team, TEAM_SPECTATORS, TEAM_BLUE)) break;
	} break;
	
	case NETMSGTYPE_DE_CLIENTLEAVE:
	{
		CNetMsg_De_ClientLeave *pMsg = (CNetMsg_De_ClientLeave *)m_aMsgData;
		(void)pMsg;
		pMsg->m_pName = pUnpacker->GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
		pMsg->m_ClientID = pUnpacker->GetInt();
		pMsg->m_pReason = pUnpacker->GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
		if(!CheckInt("m_ClientID", pMsg->m_ClientID, -1, MAX_CLIENTS-1)) break;
	} break;
	
	case NETMSGTYPE_CL_SAY:
	{
		CNetMsg_Cl_Say *pMsg = (CNetMsg_Cl_Say *)m_aMsgData;
		(void)pMsg;
		pMsg->m_Mode = pUnpacker->GetInt();
		pMsg->m_Target = pUnpacker->GetInt();
		pMsg->m_pMessage = pUnpacker->GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
		if(!CheckInt("m_Mode", pMsg->m_Mode, 0, NUM_CHATS-1)) break;
		if(!CheckInt("m_Target", pMsg->m_Target, -1, MAX_CLIENTS-1)) break;
	} break;
	
	case NETMSGTYPE_CL_SETTEAM:
	{
		CNetMsg_Cl_SetTeam *pMsg = (CNetMsg_Cl_SetTeam *)m_aMsgData;
		(void)pMsg;
		pMsg->m_Team = pUnpacker->GetInt();
		if(!CheckInt("m_Team", pMsg->m_Team, TEAM_SPECTATORS, TEAM_BLUE)) break;
	} break;
	
	case NETMSGTYPE_CL_SETSPECTATORMODE:
	{
		CNetMsg_Cl_SetSpectatorMode *pMsg = (CNetMsg_Cl_SetSpectatorMode *)m_aMsgData;
		(void)pMsg;
		pMsg->m_SpecMode = pUnpacker->GetInt();
		pMsg->m_SpectatorID = pUnpacker->GetInt();
		if(!CheckInt("m_SpecMode", pMsg->m_SpecMode, 0, NUM_SPECMODES-1)) break;
		if(!CheckInt("m_SpectatorID", pMsg->m_SpectatorID, -1, MAX_CLIENTS-1)) break;
	} break;
	
	case NETMSGTYPE_CL_STARTINFO:
	{
		CNetMsg_Cl_StartInfo *pMsg = (CNetMsg_Cl_StartInfo *)m_aMsgData;
		(void)pMsg;
		pMsg->m_pName = pUnpacker->GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
		pMsg->m_pClan = pUnpacker->GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
		pMsg->m_Country = pUnpacker->GetInt();
		pMsg->m_apSkinPartNames[0] = pUnpacker->GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
		pMsg->m_apSkinPartNames[1] = pUnpacker->GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
		pMsg->m_apSkinPartNames[2] = pUnpacker->GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
		pMsg->m_apSkinPartNames[3] = pUnpacker->GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
		pMsg->m_apSkinPartNames[4] = pUnpacker->GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
		pMsg->m_apSkinPartNames[5] = pUnpacker->GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
		pMsg->m_aUseCustomColors[0] = pUnpacker->GetInt();
		pMsg->m_aUseCustomColors[1] = pUnpacker->GetInt();
		pMsg->m_aUseCustomColors[2] = pUnpacker->GetInt();
		pMsg->m_aUseCustomColors[3] = pUnpacker->GetInt();
		pMsg->m_aUseCustomColors[4] = pUnpacker->GetInt();
		pMsg->m_aUseCustomColors[5] = pUnpacker->GetInt();
		pMsg->m_aSkinPartColors[0] = pUnpacker->GetInt();
		pMsg->m_aSkinPartColors[1] = pUnpacker->GetInt();
		pMsg->m_aSkinPartColors[2] = pUnpacker->GetInt();
		pMsg->m_aSkinPartColors[3] = pUnpacker->GetInt();
		pMsg->m_aSkinPartColors[4] = pUnpacker->GetInt();
		pMsg->m_aSkinPartColors[5] = pUnpacker->GetInt();
		if(!CheckInt("m_aUseCustomColors[0]", pMsg->m_aUseCustomColors[0], 0, 1)) break;
		if(!CheckInt("m_aUseCustomColors[1]", pMsg->m_aUseCustomColors[1], 0, 1)) break;
		if(!CheckInt("m_aUseCustomColors[2]", pMsg->m_aUseCustomColors[2], 0, 1)) break;
		if(!CheckInt("m_aUseCustomColors[3]", pMsg->m_aUseCustomColors[3], 0, 1)) break;
		if(!CheckInt("m_aUseCustomColors[4]", pMsg->m_aUseCustomColors[4], 0, 1)) break;
		if(!CheckInt("m_aUseCustomColors[5]", pMsg->m_aUseCustomColors[5], 0, 1)) break;
	} break;
	
	case NETMSGTYPE_CL_KILL:
	{
		CNetMsg_Cl_Kill *pMsg = (CNetMsg_Cl_Kill *)m_aMsgData;
		(void)pMsg;
	} break;
	
	case NETMSGTYPE_CL_READYCHANGE:
	{
		CNetMsg_Cl_ReadyChange *pMsg = (CNetMsg_Cl_ReadyChange *)m_aMsgData;
		(void)pMsg;
	} break;
	
	case NETMSGTYPE_CL_EMOTICON:
	{
		CNetMsg_Cl_Emoticon *pMsg = (CNetMsg_Cl_Emoticon *)m_aMsgData;
		(void)pMsg;
		pMsg->m_Emoticon = pUnpacker->GetInt();
		if(!CheckInt("m_Emoticon", pMsg->m_Emoticon, 0, 15)) break;
	} break;
	
	case NETMSGTYPE_CL_VOTE:
	{
		CNetMsg_Cl_Vote *pMsg = (CNetMsg_Cl_Vote *)m_aMsgData;
		(void)pMsg;
		pMsg->m_Vote = pUnpacker->GetInt();
		if(!CheckInt("m_Vote", pMsg->m_Vote, VOTE_CHOICE_NO, VOTE_CHOICE_YES)) break;
	} break;
	
	case NETMSGTYPE_CL_CALLVOTE:
	{
		CNetMsg_Cl_CallVote *pMsg = (CNetMsg_Cl_CallVote *)m_aMsgData;
		(void)pMsg;
		pMsg->m_Type = pUnpacker->GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
		pMsg->m_Value = pUnpacker->GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
		pMsg->m_Reason = pUnpacker->GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
		pMsg->m_Force = pUnpacker->GetInt();
		if(!CheckInt("m_Force", pMsg->m_Force, 0, 1)) break;
	} break;
	
	case NETMSGTYPE_SV_SKINCHANGE:
	{
		CNetMsg_Sv_SkinChange *pMsg = (CNetMsg_Sv_SkinChange *)m_aMsgData;
		(void)pMsg;
		pMsg->m_ClientID = pUnpacker->GetInt();
		pMsg->m_apSkinPartNames[0] = pUnpacker->GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
		pMsg->m_apSkinPartNames[1] = pUnpacker->GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
		pMsg->m_apSkinPartNames[2] = pUnpacker->GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
		pMsg->m_apSkinPartNames[3] = pUnpacker->GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
		pMsg->m_apSkinPartNames[4] = pUnpacker->GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
		pMsg->m_apSkinPartNames[5] = pUnpacker->GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
		pMsg->m_aUseCustomColors[0] = pUnpacker->GetInt();
		pMsg->m_aUseCustomColors[1] = pUnpacker->GetInt();
		pMsg->m_aUseCustomColors[2] = pUnpacker->GetInt();
		pMsg->m_aUseCustomColors[3] = pUnpacker->GetInt();
		pMsg->m_aUseCustomColors[4] = pUnpacker->GetInt();
		pMsg->m_aUseCustomColors[5] = pUnpacker->GetInt();
		pMsg->m_aSkinPartColors[0] = pUnpacker->GetInt();
		pMsg->m_aSkinPartColors[1] = pUnpacker->GetInt();
		pMsg->m_aSkinPartColors[2] = pUnpacker->GetInt();
		pMsg->m_aSkinPartColors[3] = pUnpacker->GetInt();
		pMsg->m_aSkinPartColors[4] = pUnpacker->GetInt();
		pMsg->m_aSkinPartColors[5] = pUnpacker->GetInt();
		if(!CheckInt("m_ClientID", pMsg->m_ClientID, 0, MAX_CLIENTS-1)) break;
		if(!CheckInt("m_aUseCustomColors[0]", pMsg->m_aUseCustomColors[0], 0, 1)) break;
		if(!CheckInt("m_aUseCustomColors[1]", pMsg->m_aUseCustomColors[1], 0, 1)) break;
		if(!CheckInt("m_aUseCustomColors[2]", pMsg->m_aUseCustomColors[2], 0, 1)) break;
		if(!CheckInt("m_aUseCustomColors[3]", pMsg->m_aUseCustomColors[3], 0, 1)) break;
		if(!CheckInt("m_aUseCustomColors[4]", pMsg->m_aUseCustomColors[4], 0, 1)) break;
		if(!CheckInt("m_aUseCustomColors[5]", pMsg->m_aUseCustomColors[5], 0, 1)) break;
	} break;
	
	case NETMSGTYPE_CL_SKINCHANGE:
	{
		CNetMsg_Cl_SkinChange *pMsg = (CNetMsg_Cl_SkinChange *)m_aMsgData;
		(void)pMsg;
		pMsg->m_apSkinPartNames[0] = pUnpacker->GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
		pMsg->m_apSkinPartNames[1] = pUnpacker->GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
		pMsg->m_apSkinPartNames[2] = pUnpacker->GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
		pMsg->m_apSkinPartNames[3] = pUnpacker->GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
		pMsg->m_apSkinPartNames[4] = pUnpacker->GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
		pMsg->m_apSkinPartNames[5] = pUnpacker->GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
		pMsg->m_aUseCustomColors[0] = pUnpacker->GetInt();
		pMsg->m_aUseCustomColors[1] = pUnpacker->GetInt();
		pMsg->m_aUseCustomColors[2] = pUnpacker->GetInt();
		pMsg->m_aUseCustomColors[3] = pUnpacker->GetInt();
		pMsg->m_aUseCustomColors[4] = pUnpacker->GetInt();
		pMsg->m_aUseCustomColors[5] = pUnpacker->GetInt();
		pMsg->m_aSkinPartColors[0] = pUnpacker->GetInt();
		pMsg->m_aSkinPartColors[1] = pUnpacker->GetInt();
		pMsg->m_aSkinPartColors[2] = pUnpacker->GetInt();
		pMsg->m_aSkinPartColors[3] = pUnpacker->GetInt();
		pMsg->m_aSkinPartColors[4] = pUnpacker->GetInt();
		pMsg->m_aSkinPartColors[5] = pUnpacker->GetInt();
		if(!CheckInt("m_aUseCustomColors[0]", pMsg->m_aUseCustomColors[0], 0, 1)) break;
		if(!CheckInt("m_aUseCustomColors[1]", pMsg->m_aUseCustomColors[1], 0, 1)) break;
		if(!CheckInt("m_aUseCustomColors[2]", pMsg->m_aUseCustomColors[2], 0, 1)) break;
		if(!CheckInt("m_aUseCustomColors[3]", pMsg->m_aUseCustomColors[3], 0, 1)) break;
		if(!CheckInt("m_aUseCustomColors[4]", pMsg->m_aUseCustomColors[4], 0, 1)) break;
		if(!CheckInt("m_aUseCustomColors[5]", pMsg->m_aUseCustomColors[5], 0, 1)) break;
	} break;
	
	case NETMSGTYPE_SV_RACEFINISH:
	{
		CNetMsg_Sv_RaceFinish *pMsg = (CNetMsg_Sv_RaceFinish *)m_aMsgData;
		(void)pMsg;
		pMsg->m_ClientID = pUnpacker->GetInt();
		pMsg->m_Time = pUnpacker->GetInt();
		pMsg->m_Diff = pUnpacker->GetInt();
		pMsg->m_RecordPersonal = pUnpacker->GetInt();
		pMsg->m_RecordServer = pUnpacker->GetIntOrDefault(0);
		if(!CheckInt("m_ClientID", pMsg->m_ClientID, 0, MAX_CLIENTS-1)) break;
		if(!CheckInt("m_Time", pMsg->m_Time, -1, max_int)) break;
		if(!CheckInt("m_RecordPersonal", pMsg->m_RecordPersonal, 0, 1)) break;
		if(!CheckInt("m_RecordServer", pMsg->m_RecordServer, 0, 1)) break;
	} break;
	
	case NETMSGTYPE_SV_CHECKPOINT:
	{
		CNetMsg_Sv_Checkpoint *pMsg = (CNetMsg_Sv_Checkpoint *)m_aMsgData;
		(void)pMsg;
		pMsg->m_Diff = pUnpacker->GetInt();
	} break;
	
	case NETMSGTYPE_SV_COMMANDINFO:
	{
		CNetMsg_Sv_CommandInfo *pMsg = (CNetMsg_Sv_CommandInfo *)m_aMsgData;
		(void)pMsg;
		pMsg->m_Name = pUnpacker->GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
		pMsg->m_ArgsFormat = pUnpacker->GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
		pMsg->m_HelpText = pUnpacker->GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
	} break;
	
	case NETMSGTYPE_SV_COMMANDINFOREMOVE:
	{
		CNetMsg_Sv_CommandInfoRemove *pMsg = (CNetMsg_Sv_CommandInfoRemove *)m_aMsgData;
		(void)pMsg;
		pMsg->m_Name = pUnpacker->GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
	} break;
	
	case NETMSGTYPE_CL_COMMAND:
	{
		CNetMsg_Cl_Command *pMsg = (CNetMsg_Cl_Command *)m_aMsgData;
		(void)pMsg;
		pMsg->m_Name = pUnpacker->GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
		pMsg->m_Arguments = pUnpacker->GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
	} break;
	
	default:
		m_pMsgFailedOn = "(type out of range)";
		break;
	}
	
	if(pUnpacker->Error())
		m_pMsgFailedOn = "(unpack error)";
	
	if(m_pMsgFailedOn || m_pObjFailedOn) {
		if(!m_pMsgFailedOn)
			m_pMsgFailedOn = "";
		if(!m_pObjFailedOn)
			m_pObjFailedOn = "";
		return 0;
	}
	m_pMsgFailedOn = "";
	m_pObjFailedOn = "";
	return m_aMsgData;
}